

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O1

void __thiscall
icu_63::TailoredSet::compareContractions(TailoredSet *this,UChar32 c,UChar *p,UChar *q)

{
  UErrorCode *errorCode;
  short sVar1;
  ushort uVar2;
  UBool UVar3;
  byte bVar4;
  char16_t *srcChars;
  int iVar5;
  int32_t length;
  int srcStart;
  int srcLength;
  UnicodeString *this_00;
  UnicodeString *sfx;
  UnicodeString none;
  Iterator baseSuffixes;
  Iterator suffixes;
  UChar local_192;
  ConstChar16Ptr local_190;
  ConstChar16Ptr local_188;
  UChar *local_180;
  UChar *local_170;
  UnicodeString local_160;
  Iterator local_120;
  Iterator local_a8;
  
  errorCode = &this->errorCode;
  local_188.p_ = p;
  UCharsTrie::Iterator::Iterator(&local_a8,&local_188,0,errorCode);
  local_170 = local_188.p_;
  local_190.p_ = q;
  UCharsTrie::Iterator::Iterator(&local_120,&local_190,0,errorCode);
  local_180 = local_190.p_;
  UnicodeString::UnicodeString(&local_160,L'\xffff');
  local_192 = L'\xffff';
  UnicodeString::doAppend(&local_160,&local_192,0,1);
  do {
    this_00 = (UnicodeString *)0x0;
    sfx = (UnicodeString *)0x0;
    while( true ) {
      while( true ) {
        if (this_00 == (UnicodeString *)0x0) {
          UVar3 = UCharsTrie::Iterator::next(&local_a8,errorCode);
          this_00 = &local_160;
          if (UVar3 != '\0') {
            this_00 = &local_a8.str_;
          }
        }
        if (sfx == (UnicodeString *)0x0) {
          UVar3 = UCharsTrie::Iterator::next(&local_120,errorCode);
          sfx = &local_160;
          if (UVar3 != '\0') {
            sfx = &local_120.str_;
          }
        }
        if ((this_00 == &local_160) && (sfx == &local_160)) {
          UnicodeString::~UnicodeString(&local_160);
          UCharsTrie::Iterator::~Iterator(&local_120);
          UCharsTrie::Iterator::~Iterator(&local_a8);
          return;
        }
        sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
        uVar2 = (sfx->fUnion).fStackFields.fLengthAndFlags;
        if ((uVar2 & 1) == 0) {
          if ((short)uVar2 < 0) {
            iVar5 = (sfx->fUnion).fFields.fLength;
          }
          else {
            iVar5 = (int)(short)uVar2 >> 5;
          }
          srcStart = iVar5;
          if (-1 < iVar5) {
            srcStart = 0;
          }
          srcLength = iVar5 - srcStart;
          if (iVar5 <= iVar5 - srcStart) {
            srcLength = iVar5;
          }
          if (iVar5 < 0) {
            srcLength = 0;
          }
          if (sVar1 < 0) {
            length = (this_00->fUnion).fFields.fLength;
          }
          else {
            length = (int)sVar1 >> 5;
          }
          if ((uVar2 & 2) == 0) {
            srcChars = (sfx->fUnion).fFields.fArray;
          }
          else {
            srcChars = (sfx->fUnion).fStackFields.fBuffer;
          }
          bVar4 = UnicodeString::doCompare(this_00,0,length,srcChars,srcStart,srcLength);
        }
        else {
          bVar4 = ~(byte)sVar1 & 1;
        }
        if (-1 < (char)bVar4) break;
        addSuffix(this,c,this_00);
        this_00 = (UnicodeString *)0x0;
      }
      if (bVar4 == 0) break;
      addSuffix(this,c,sfx);
      sfx = (UnicodeString *)0x0;
    }
    this->suffix = this_00;
    compare(this,c,local_a8.value_,local_120.value_);
    this->suffix = (UnicodeString *)0x0;
  } while( true );
}

Assistant:

void
TailoredSet::compareContractions(UChar32 c, const UChar *p, const UChar *q) {
    // Parallel iteration over suffixes of both tables.
    UCharsTrie::Iterator suffixes(p, 0, errorCode);
    UCharsTrie::Iterator baseSuffixes(q, 0, errorCode);
    const UnicodeString *ts = NULL;  // Tailoring suffix.
    const UnicodeString *bs = NULL;  // Base suffix.
    // Use a string with two U+FFFF as the limit sentinel.
    // U+FFFF is untailorable and will not occur in contractions except maybe
    // as a single suffix character for a root-collator boundary contraction.
    UnicodeString none((UChar)0xffff);
    none.append((UChar)0xffff);
    for(;;) {
        if(ts == NULL) {
            if(suffixes.next(errorCode)) {
                ts = &suffixes.getString();
            } else {
                ts = &none;
            }
        }
        if(bs == NULL) {
            if(baseSuffixes.next(errorCode)) {
                bs = &baseSuffixes.getString();
            } else {
                bs = &none;
            }
        }
        if(ts == &none && bs == &none) { break; }
        int32_t cmp = ts->compare(*bs);
        if(cmp < 0) {
            // ts occurs in the tailoring but not in the base.
            addSuffix(c, *ts);
            ts = NULL;
        } else if(cmp > 0) {
            // bs occurs in the base but not in the tailoring.
            addSuffix(c, *bs);
            bs = NULL;
        } else {
            suffix = ts;
            compare(c, (uint32_t)suffixes.getValue(), (uint32_t)baseSuffixes.getValue());
            suffix = NULL;
            ts = NULL;
            bs = NULL;
        }
    }
}